

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgLoadNeededValues.hpp
# Opt level: O0

void TasGrid::loadNeededValues<true,true>
               (function<void_(const_double_*,_double_*,_unsigned_long)> *model,
               TasmanianSparseGrid *grid,size_t num_threads)

{
  allocator<double> *this;
  allocator<bool> *this_00;
  bool bVar1;
  int b;
  int iVar2;
  runtime_error *prVar3;
  size_t __n;
  double *pdVar4;
  size_type __n_00;
  double *__args_1;
  int local_164;
  int i;
  thread *w;
  iterator __end3;
  iterator __begin3;
  vector<std::thread,_std::allocator<std::thread>_> *__range3;
  pointer *local_138;
  int *local_130;
  vector<bool,_std::allocator<bool>_> *local_128;
  function<void_(const_double_*,_double_*,_unsigned_long)> *local_120;
  Wrapper2D<double> *local_118;
  Wrapper2D<double> *local_110;
  vector<std::thread,_std::allocator<std::thread>_> *local_108;
  size_t thread_id;
  vector<std::thread,_std::allocator<std::thread>_> workers;
  mutex checked_out_lock;
  undefined1 local_b8 [8];
  vector<bool,_std::allocator<bool>_> checked_out;
  Wrapper2D<double> ywrap;
  Wrapper2D<double> xwrap;
  undefined1 local_68 [8];
  vector<double,_std::allocator<double>_> values;
  vector<double,_std::allocator<double>_> points;
  int local_24;
  int num_outputs;
  int num_points;
  size_t num_threads_local;
  TasmanianSparseGrid *grid_local;
  function<void_(const_double_*,_double_*,_unsigned_long)> *model_local;
  
  _num_outputs = (vector<std::thread,_std::allocator<std::thread>_> *)num_threads;
  num_threads_local = (size_t)grid;
  grid_local = (TasmanianSparseGrid *)model;
  local_24 = TasmanianSparseGrid::getNumLoaded(grid);
  b = TasmanianSparseGrid::getNumOutputs((TasmanianSparseGrid *)num_threads_local);
  bVar1 = TasmanianSparseGrid::isUsingConstruction((TasmanianSparseGrid *)num_threads_local);
  if (bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,
               "ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (b == 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar3,"ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_24 != 0) {
    iVar2 = TasmanianSparseGrid::getNumNeeded((TasmanianSparseGrid *)num_threads_local);
    if (iVar2 != 0) {
      TasGrid::TasmanianSparseGrid::clearRefinement();
    }
    TasmanianSparseGrid::getLoadedPoints
              ((vector<double,_std::allocator<double>_> *)
               &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage,(TasmanianSparseGrid *)num_threads_local);
    __n = Utils::size_mult<int,int>(local_24,b);
    this = (allocator<double> *)((long)&xwrap.data + 7);
    std::allocator<double>::allocator(this);
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)local_68,__n,this);
    std::allocator<double>::~allocator((allocator<double> *)((long)&xwrap.data + 7));
    iVar2 = TasmanianSparseGrid::getNumDimensions((TasmanianSparseGrid *)num_threads_local);
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)
                        &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage);
    Utils::Wrapper2D<double>::Wrapper2D((Wrapper2D<double> *)&ywrap.data,iVar2,pdVar4);
    pdVar4 = std::vector<double,_std::allocator<double>_>::data
                       ((vector<double,_std::allocator<double>_> *)local_68);
    Utils::Wrapper2D<double>::Wrapper2D
              ((Wrapper2D<double> *)
               &checked_out.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage,b,pdVar4);
    if (_num_outputs == (vector<std::thread,_std::allocator<std::thread>_> *)0x0) {
      for (local_164 = 0; local_164 < local_24; local_164 = local_164 + 1) {
        pdVar4 = Utils::Wrapper2D<double>::getStrip((Wrapper2D<double> *)&ywrap.data,local_164);
        __args_1 = Utils::Wrapper2D<double>::getStrip
                             ((Wrapper2D<double> *)
                              &checked_out.super__Bvector_base<std::allocator<bool>_>._M_impl.
                               super__Bvector_impl_data._M_end_of_storage,local_164);
        std::function<void_(const_double_*,_double_*,_unsigned_long)>::operator()
                  (model,pdVar4,__args_1,0);
      }
    }
    else {
      __n_00 = (size_type)local_24;
      checked_out_lock.super___mutex_base._M_mutex.__size[0x27] = '\0';
      this_00 = (allocator<bool> *)
                ((long)&checked_out_lock.super___mutex_base._M_mutex.__data.__list.__next + 6);
      std::allocator<bool>::allocator(this_00);
      std::vector<bool,_std::allocator<bool>_>::vector
                ((vector<bool,_std::allocator<bool>_> *)local_b8,__n_00,
                 (bool *)(checked_out_lock.super___mutex_base._M_mutex.__size + 0x27),this_00);
      std::allocator<bool>::~allocator
                ((allocator<bool> *)
                 ((long)&checked_out_lock.super___mutex_base._M_mutex.__data.__list.__next + 6));
      std::mutex::mutex((mutex *)&workers.
                                  super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      std::vector<std::thread,_std::allocator<std::thread>_>::vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_id);
      std::vector<std::thread,_std::allocator<std::thread>_>::reserve
                ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_id,
                 (size_type)_num_outputs);
      for (local_108 = (vector<std::thread,_std::allocator<std::thread>_> *)0x0;
          local_108 < _num_outputs;
          local_108 = (vector<std::thread,_std::allocator<std::thread>_> *)
                      ((long)&(local_108->
                              super__Vector_base<std::thread,_std::allocator<std::thread>_>)._M_impl
                              .super__Vector_impl_data._M_start + 1)) {
        __range3 = local_108;
        local_138 = &workers.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
        local_130 = &local_24;
        local_128 = (vector<bool,_std::allocator<bool>_> *)local_b8;
        local_118 = (Wrapper2D<double> *)&ywrap.data;
        local_110 = (Wrapper2D<double> *)
                    &checked_out.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage;
        local_120 = model;
        std::vector<std::thread,std::allocator<std::thread>>::
        emplace_back<TasGrid::loadNeededValues<true,true>(std::function<void(double_const*,double*,unsigned_long)>,TasGrid::TasmanianSparseGrid&,unsigned_long)::_lambda()_1_>
                  ((vector<std::thread,std::allocator<std::thread>> *)&thread_id,(type *)&__range3);
      }
      __end3 = std::vector<std::thread,_std::allocator<std::thread>_>::begin
                         ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_id);
      w = (thread *)
          std::vector<std::thread,_std::allocator<std::thread>_>::end
                    ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_id);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>
                                         *)&w), bVar1) {
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator*(&__end3);
        std::thread::join();
        __gnu_cxx::
        __normal_iterator<std::thread_*,_std::vector<std::thread,_std::allocator<std::thread>_>_>::
        operator++(&__end3);
      }
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector
                ((vector<std::thread,_std::allocator<std::thread>_> *)&thread_id);
      std::vector<bool,_std::allocator<bool>_>::~vector
                ((vector<bool,_std::allocator<bool>_> *)local_b8);
    }
    TasmanianSparseGrid::loadNeededPoints
              ((TasmanianSparseGrid *)num_threads_local,
               (vector<double,_std::allocator<double>_> *)local_68);
    Utils::Wrapper2D<double>::~Wrapper2D
              ((Wrapper2D<double> *)
               &checked_out.super__Bvector_base<std::allocator<bool>_>._M_impl.
                super__Bvector_impl_data._M_end_of_storage);
    Utils::Wrapper2D<double>::~Wrapper2D((Wrapper2D<double> *)&ywrap.data);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)local_68);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               &values.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  return;
}

Assistant:

void loadNeededValues(std::function<void(double const x[], double y[], size_t thread_id)> model, TasmanianSparseGrid &grid, size_t num_threads){
    int num_points = (overwrite_loaded) ? grid.getNumLoaded() : grid.getNumNeeded();
    int num_outputs = grid.getNumOutputs();
    if (grid.isUsingConstruction()) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when isUsingConstruction() is true");
    if (num_outputs == 0) throw std::runtime_error("ERROR: cannot call loadNeededPoints() addon when the grid has no outputs");
    if (num_points == 0) return; // nothing to do here
    if (overwrite_loaded && (grid.getNumNeeded() != 0)) grid.clearRefinement(); // using loaded points only, clear the refinement

    // get the points and values
    auto points = (overwrite_loaded) ? grid.getLoadedPoints() : grid.getNeededPoints();
    std::vector<double> values(Utils::size_mult(num_points, num_outputs));

    // divide logically into strips
    Utils::Wrapper2D<double> xwrap(grid.getNumDimensions(), points.data());
    Utils::Wrapper2D<double> ywrap(num_outputs, values.data());

    if (parallel_construction && (num_threads > 0)){
        std::vector<bool> checked_out(num_points, false);
        std::mutex checked_out_lock;

        std::vector<std::thread> workers;
        workers.reserve(num_threads);
        for(size_t thread_id=0; thread_id<num_threads; thread_id++){
            workers.emplace_back( // create a new worker thread
                [&, thread_id](void)->void{
                    int sample = 0;
                    do{
                        { // find the next sample
                            std::lock_guard<std::mutex> lock(checked_out_lock);
                            while ((sample < num_points) && checked_out[sample]) sample++;
                            if (sample < num_points) checked_out[sample] = true;
                        }
                        if (sample < num_points) // if found, compute the next sample
                            model(xwrap.getStrip(sample), ywrap.getStrip(sample), thread_id);
                    }while(sample < num_points);
                }
            );
        }

        for(auto &w : workers) w.join(); // wait till finished

    }else{
        for(int i=0; i<num_points; i++)
            model(xwrap.getStrip(i), ywrap.getStrip(i), 0);
    }

    grid.loadNeededPoints(values);
}